

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Render.cpp
# Opt level: O2

void render_scene(Scene *scene,double half_width,double half_height,int nx,int ny,char *fname)

{
  int iVar1;
  int iVar2;
  double x;
  ulong in_XMM0_Qb;
  Ray ray;
  double local_118;
  long *local_110;
  int local_104;
  int local_100;
  int local_fc;
  double local_f8;
  ulong uStack_f0;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_b8;
  double dStack_b0;
  Vector local_a8;
  Color local_88;
  char *local_68;
  Ray local_60;
  
  local_c8 = (half_width + half_width) / (double)nx;
  local_e0 = (half_height + half_height) / (double)ny;
  local_100 = ny;
  local_fc = nx;
  local_f8 = half_width;
  uStack_f0 = in_XMM0_Qb;
  local_68 = fname;
  std::make_unique<TargaImage,char_const*&,int&,int&>
            ((char **)&local_110,(int *)&local_68,&local_fc);
  local_f8 = -local_f8;
  uStack_f0 = uStack_f0 ^ 0x8000000000000000;
  iVar1 = 0;
  local_118 = half_height;
  while (iVar1 < local_100) {
    x = local_f8;
    local_104 = iVar1;
    for (iVar2 = 0; iVar2 < local_fc; iVar2 = iVar2 + 1) {
      TotalPixels = TotalPixels + 1;
      local_d0 = x;
      Scene::camera(scene,x,local_118,&local_60);
      Scene::trace(&local_88,scene,&Grayzer::Medium::air,1.0,&local_60);
      local_b8 = local_88.x;
      dStack_b0 = local_88.y;
      local_a8.x = local_88.x;
      local_a8.y = local_88.y;
      local_d8 = local_88.z;
      local_a8.z = local_88.z;
      clip(&local_a8);
      (**(code **)(*local_110 + 0x18))
                (local_110,
                 (int)(local_b8 * 255.0) & 0xffU |
                 ((int)(dStack_b0 * 255.0) & 0xffU) << 8 | (int)(local_d8 * 255.0) << 0x10);
      x = local_d0 + local_c8;
    }
    local_118 = local_118 - local_e0;
    iVar1 = local_104 + 1;
  }
  if (local_110 != (long *)0x0) {
    (**(code **)(*local_110 + 8))();
  }
  return;
}

Assistant:

void render_scene(Scene* scene, double half_width, double half_height,
               int nx, int ny,
               char const* fname)
{
   double x, y;
   double hx = 2.0   * half_width  /   nx;
   double hy = 2.0   * half_height /   ny;
   Ray   ray;
   Vector color;
   int   i, j;

   auto tga = std::make_unique<TargaImage>( fname, nx, ny );
   rgb   c;

/* $NB$ what is it? where it from?  how   it got here?

   left unused: does much unnecessary work   (I think so),
            produces very funny  TGA   files (pixels intermixed)
   for(int  yfactor  = 16; yfactor >   0; yfactor--)
      for(int  xfactor  = 16; xfactor >   0; xfactor--)
         for(i=0,y=HalfHeight;i<ny;i+=yfactor,y-=hy*yfactor)
         {
            for(j=0,x=-HalfWidth;j<nx;j+=xfactor,x+=hx*xfactor)
*/
   for( i = 0, y =   half_height; i < ny; i++, y   -= hy )
   {
      for( j = 0, x =   -half_width; j < nx; j++, x   += hx )
      {
         TotalPixels++;

         scene->camera(x, y, ray);

         color = scene->trace( Grayzer::Medium::air, 1.0, ray );
         clip( color );

         c.r   = color.x * 255;
         c.g   = color.y * 255;
         c.b   = color.z * 255;

         tga->put_pixel(c);
      }
   }
}